

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# determinization.cc
# Opt level: O2

void __thiscall re2c::dfa_t::dfa_t(dfa_t *this,nfa_t *nfa,charset_t *charset,rules_t *rules)

{
  int iVar1;
  pointer ppdVar2;
  pointer ppdVar3;
  dfa_state_t *pdVar4;
  RuleOp *pRVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  nfa_state_t **end;
  _Rb_tree<re2c::RuleOp*,re2c::RuleOp*,std::_Identity<re2c::RuleOp*>,std::less<re2c::RuleOp*>,std::allocator<re2c::RuleOp*>>
  *this_00;
  size_t *psVar9;
  nfa_state_t **ppnVar10;
  size_t sVar11;
  mapped_type *pmVar12;
  _Base_ptr p_Var13;
  mapped_type *pmVar14;
  pointer *pppnVar15;
  long lVar16;
  size_t j;
  ulong uVar17;
  pointer ppnVar18;
  long lVar19;
  long lVar20;
  size_t c;
  size_type __n;
  int *piVar21;
  ulong uVar22;
  _Rb_tree_header *p_Var23;
  bool bVar24;
  ulong local_f8;
  nfa_state_t **local_f0;
  dfa_state_t *s;
  rules_t *local_e0;
  elem_t *local_d8;
  ulong local_d0;
  nfa_state_t *m;
  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  arcs;
  ord_hash_set_t kernels;
  map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
  s2rules;
  
  (this->states).super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->states).super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states).super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = ((long)(charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start >> 2) - 1;
  this->nchars = __n;
  s2rules._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &s2rules._M_t._M_impl.super__Rb_tree_header._M_header;
  s2rules._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  s2rules._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  s2rules._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  kernels.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &kernels.lookup._M_t._M_impl.super__Rb_tree_header._M_header;
  kernels.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  kernels.lookup._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  kernels.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  kernels.elems.
  super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  kernels.lookup._M_t._M_impl._0_8_ = 0;
  kernels.elems.
  super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  kernels.elems.
  super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  kernels.lookup._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0 = rules;
  kernels.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       kernels.lookup._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  s2rules._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       s2rules._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f0 = (nfa_state_t **)operator_new__((ulong)nfa->size << 3);
  std::
  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  ::vector(&arcs,__n,(allocator_type *)&local_f8);
  ppnVar10 = local_f0;
  end = closure(local_f0,nfa->root);
  find_state(ppnVar10,end,&kernels);
  for (local_f8 = 0;
      local_f8 <
      (ulong)((long)kernels.elems.
                    super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)kernels.elems.
                    super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3); local_f8 = local_f8 + 1) {
    s = (dfa_state_t *)operator_new(0x18);
    s->arcs = (size_t *)0x0;
    s->rule = (RuleOp *)0x0;
    s->ctx = false;
    std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::push_back
              (&this->states,&s);
    local_d8 = kernels.elems.
               super__Vector_base<re2c::ord_hash_set_t::elem_t_*,_std::allocator<re2c::ord_hash_set_t::elem_t_*>_>
               ._M_impl.super__Vector_impl_data._M_start[local_f8];
    local_d0 = local_d8->size >> 3;
    for (uVar17 = 0; uVar17 != local_d0; uVar17 = uVar17 + 1) {
      piVar21 = *(int **)(local_d8->data + uVar17 * 8);
      iVar1 = *piVar21;
      if (iVar1 == 3) {
        this_00 = (_Rb_tree<re2c::RuleOp*,re2c::RuleOp*,std::_Identity<re2c::RuleOp*>,std::less<re2c::RuleOp*>,std::allocator<re2c::RuleOp*>>
                   *)std::
                     map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
                     ::operator[](&s2rules,&local_f8);
        std::
        _Rb_tree<re2c::RuleOp*,re2c::RuleOp*,std::_Identity<re2c::RuleOp*>,std::less<re2c::RuleOp*>,std::allocator<re2c::RuleOp*>>
        ::_M_insert_unique<re2c::RuleOp*const&>(this_00,(RuleOp **)(piVar21 + 2));
      }
      else if (iVar1 == 2) {
        s->ctx = true;
      }
      else if (iVar1 == 1) {
        m = *(nfa_state_t **)(piVar21 + 2);
        piVar21 = piVar21 + 4;
        lVar20 = 0;
        while (piVar21 = *(int **)piVar21, piVar21 != (int *)0x0) {
          uVar8 = piVar21[2];
          lVar7 = lVar20 * 0x18;
          lVar19 = lVar20 + -1;
          do {
            lVar16 = lVar7;
            lVar20 = lVar19 + 1;
            lVar6 = lVar19 + 1;
            lVar7 = lVar16 + 0x18;
            lVar19 = lVar20;
          } while ((charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[lVar6] != uVar8);
          while (uVar8 != piVar21[3]) {
            std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>::push_back
                      ((vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_> *)
                       ((long)&((arcs.
                                 super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar16),&m);
            lVar7 = lVar20 + 1;
            lVar20 = lVar20 + 1;
            lVar16 = lVar16 + 0x18;
            uVar8 = (charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar7];
          }
        }
      }
    }
    uVar17 = this->nchars;
    psVar9 = (size_t *)operator_new__(-(ulong)(uVar17 >> 0x3d != 0) | uVar17 * 8);
    s->arcs = psVar9;
    for (uVar22 = 0; uVar22 < uVar17; uVar22 = uVar22 + 1) {
      ppnVar10 = local_f0;
      for (ppnVar18 = arcs.
                      super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar22].
                      super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          ppnVar18 !=
          arcs.
          super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar22].
          super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppnVar18 = ppnVar18 + 1) {
        ppnVar10 = closure(ppnVar10,*ppnVar18);
      }
      sVar11 = find_state(local_f0,ppnVar10,&kernels);
      s->arcs[uVar22] = sVar11;
      uVar17 = this->nchars;
    }
    pppnVar15 = &((arcs.
                   super__Vector_base<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
    while (bVar24 = uVar17 != 0, uVar17 = uVar17 - 1, bVar24) {
      if (*pppnVar15 != ((_Vector_impl_data *)(pppnVar15 + -1))->_M_start) {
        *pppnVar15 = ((_Vector_impl_data *)(pppnVar15 + -1))->_M_start;
      }
      pppnVar15 = pppnVar15 + 3;
    }
  }
  operator_delete__(local_f0);
  ppdVar2 = (this->states).
            super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppdVar3 = (this->states).
            super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (local_f8 = 0; local_f8 < (ulong)((long)ppdVar2 - (long)ppdVar3 >> 3); local_f8 = local_f8 + 1
      ) {
    pdVar4 = (this->states).
             super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
             super__Vector_impl_data._M_start[local_f8];
    pmVar12 = std::
              map<unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
              ::operator[](&s2rules,&local_f8);
    p_Var23 = &(pmVar12->_M_t)._M_impl.super__Rb_tree_header;
    for (p_Var13 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var13 != p_Var23; p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)
        ) {
      pRVar5 = *(RuleOp **)(p_Var13 + 1);
      if ((pdVar4->rule == (RuleOp *)0x0) ||
         (bVar24 = rule_rank_t::operator<(&pRVar5->rank,&pdVar4->rule->rank), bVar24)) {
        pdVar4->rule = pRVar5;
      }
    }
    for (p_Var13 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var13 != p_Var23; p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)
        ) {
      if (pdVar4->rule != *(RuleOp **)(p_Var13 + 1)) {
        pmVar14 = std::
                  map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                  ::operator[](local_e0,&(*(RuleOp **)(p_Var13 + 1))->rank);
        std::
        _Rb_tree<re2c::rule_rank_t,re2c::rule_rank_t,std::_Identity<re2c::rule_rank_t>,std::less<re2c::rule_rank_t>,std::allocator<re2c::rule_rank_t>>
        ::_M_insert_unique<re2c::rule_rank_t_const&>
                  ((_Rb_tree<re2c::rule_rank_t,re2c::rule_rank_t,std::_Identity<re2c::rule_rank_t>,std::less<re2c::rule_rank_t>,std::allocator<re2c::rule_rank_t>>
                    *)&pmVar14->shadow,&pdVar4->rule->rank);
      }
    }
  }
  std::
  vector<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>,_std::allocator<std::vector<re2c::nfa_state_t_*,_std::allocator<re2c::nfa_state_t_*>_>_>_>
  ::~vector(&arcs);
  ord_hash_set_t::~ord_hash_set_t(&kernels);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<re2c::RuleOp_*,_std::less<re2c::RuleOp_*>,_std::allocator<re2c::RuleOp_*>_>_>_>_>
  ::~_Rb_tree(&s2rules._M_t);
  return;
}

Assistant:

dfa_t::dfa_t(const nfa_t &nfa, const charset_t &charset, rules_t &rules)
	: states()
	, nchars(charset.size() - 1) // (n + 1) bounds for n ranges
{
	std::map<size_t, std::set<RuleOp*> > s2rules;
	ord_hash_set_t kernels;
	nfa_state_t **const buffer = new nfa_state_t*[nfa.size];
	std::vector<std::vector<nfa_state_t*> > arcs(nchars);

	find_state(buffer, closure(buffer, nfa.root), kernels);
	for (size_t i = 0; i < kernels.size(); ++i)
	{
		dfa_state_t *s = new dfa_state_t;
		states.push_back(s);

		nfa_state_t **kernel;
		const size_t kernel_size = kernels.deref<nfa_state_t*>(i, kernel);
		for (size_t j = 0; j < kernel_size; ++j)
		{
			nfa_state_t *n = kernel[j];
			switch (n->type)
			{
				case nfa_state_t::RAN:
				{
					nfa_state_t *m = n->value.ran.out;
					size_t c = 0;
					for (Range *r = n->value.ran.ran; r; r = r->next ())
					{
						for (; charset[c] != r->lower(); ++c);
						for (; charset[c] != r->upper(); ++c)
						{
							arcs[c].push_back(m);
						}
					}
					break;
				}
				case nfa_state_t::CTX:
					s->ctx = true;
					break;
				case nfa_state_t::FIN:
					s2rules[i].insert(n->value.fin.rule);
					break;
				default:
					break;
			}
		}

		s->arcs = new size_t[nchars];
		for(size_t c = 0; c < nchars; ++c)
		{
			nfa_state_t **end = buffer;
			for (std::vector<nfa_state_t*>::const_iterator j = arcs[c].begin(); j != arcs[c].end(); ++j)
			{
				end = closure(end, *j);
			}
			s->arcs[c] = find_state(buffer, end, kernels);
		}

		for(size_t c = 0; c < nchars; ++c)
		{
			arcs[c].clear();
		}
	}
	delete[] buffer;

	const size_t count = states.size();
	for (size_t i = 0; i < count; ++i)
	{
		dfa_state_t *s = states[i];
		std::set<RuleOp*> &rs = s2rules[i];
		// for each final state: choose the rule with the smallest rank
		for (std::set<RuleOp*>::const_iterator j = rs.begin(); j != rs.end(); ++j)
		{
			RuleOp *rule = *j;
			if (!s->rule || rule->rank < s->rule->rank)
			{
				s->rule = rule;
			}
		}
		// other rules are shadowed by the chosen rule
		for (std::set<RuleOp*>::const_iterator j = rs.begin(); j != rs.end(); ++j)
		{
			RuleOp *rule = *j;
			if (s->rule != rule)
			{
				rules[rule->rank].shadow.insert(s->rule->rank);
			}
		}
	}
}